

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffgi4b(fitsfile *fptr,LONGLONG byteloc,long nvals,long incre,int *values,int *status)

{
  long in_RCX;
  fitsfile *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  int *in_R9;
  LONGLONG postemp;
  fitsfile *in_stack_00000038;
  long in_stack_ffffffffffffffc8;
  int err_mode;
  
  err_mode = (int)((ulong)in_R8 >> 0x20);
  if (in_RCX == 4) {
    if ((long)in_RDX * 4 < 0x21c0) {
      ffmbyt(in_RDX,4,err_mode,in_R9);
      ffgbyt((fitsfile *)byteloc,nvals,(void *)incre,values);
    }
    else {
      in_stack_ffffffffffffffc8 = *(long *)(*(long *)(in_RDI + 8) + 0x40);
      *(undefined8 *)(*(long *)(in_RDI + 8) + 0x40) = in_RSI;
      ffgbyt((fitsfile *)byteloc,nvals,(void *)incre,values);
      *(long *)(*(long *)(in_RDI + 8) + 0x40) = in_stack_ffffffffffffffc8;
    }
  }
  else {
    ffmbyt(in_RDX,in_RCX,err_mode,in_R9);
    ffgbytoff(in_stack_00000038,(long)fptr,byteloc,nvals,(void *)incre,values);
  }
  ffswap4(in_R9,in_stack_ffffffffffffffc8);
  return *in_R9;
}

Assistant:

int ffgi4b(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG byteloc,   /* I - position within file to start reading    */
           long nvals,      /* I - number of pixels to read                 */
           long incre,      /* I - byte increment between pixels            */
           INT32BIT *values, /* O - returned array of values                */
           int *status)     /* IO - error status                            */
/*
  get (read) the array of values from the FITS file, doing machine dependent
  format conversion (e.g. byte-swapping) if necessary.
*/
{
    LONGLONG postemp;

    if (incre == 4)      /* read all the values at once (contiguous bytes) */
    {
        if (nvals * 4 < MINDIRECT)  /* read normally via IO buffers */
        {
           ffmbyt(fptr, byteloc, REPORT_EOF, status);
           ffgbyt(fptr, nvals * 4, values, status);
        }
        else            /* read directly from disk, bypassing IO buffers */
        {
           postemp = (fptr->Fptr)->bytepos;   /* store current file position */
           (fptr->Fptr)->bytepos = byteloc;   /* set to the desired position */
           ffgbyt(fptr, nvals * 4, values, status);
           (fptr->Fptr)->bytepos = postemp;   /* reset to original position */
        }
    }
    else         /* have to read each value individually (not contiguous ) */
    {
        ffmbyt(fptr, byteloc, REPORT_EOF, status);
        ffgbytoff(fptr, 4, nvals, incre - 4, values, status);
    }

#if BYTESWAPPED
    ffswap4(values, nvals);    /* reverse order of bytes in each value */
#endif

    return(*status);
}